

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(CompilerMSL *this,string *ep_args)

{
  bool bVar1;
  uint32_t uVar2;
  Resource *pRVar3;
  Resource *pRVar4;
  size_t sVar5;
  CompilerError *pCVar6;
  char *pcVar7;
  ulong uVar8;
  SPIRType *pSVar9;
  size_type sVar10;
  uint *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  string local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f40;
  string local_f20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e80;
  string local_e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_de0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  SPIRType *local_d40;
  SPIRType *parent_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  string local_c98 [32];
  string local_c78;
  char *local_c58;
  char *cv_flags;
  Bitset *local_c48;
  Bitset *flags;
  string local_c38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b98;
  string local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  string local_b18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  string local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  SPIRType *local_a38;
  SPIRType *basetype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  string local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  string local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  allocator local_829;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  uint32_t local_7a4;
  string local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  uint local_75c;
  string local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  string local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  uint local_5b8;
  uint local_5b4;
  uint32_t i;
  uint32_t array_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  uint32_t local_38c;
  undefined1 local_385;
  uint32_t local_384;
  undefined1 local_380 [3];
  bool ssbo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  ID local_2c0;
  uint32_t local_2bc;
  ID local_2b8;
  uint32_t local_2b4;
  undefined1 local_2b0 [8];
  string primary_name;
  mapped_type *m;
  SPIRType *pSStack_280;
  uint32_t var_id;
  SPIRType *type;
  SPIRVariable *var;
  Resource *r;
  Resource *__end1;
  Resource *__begin1;
  SmallVector<Resource,_8UL> *__range1;
  anon_class_16_2_ef385292 local_240;
  undefined1 local_230 [8];
  SmallVector<Resource,_8UL> resources;
  string *ep_args_local;
  CompilerMSL *this_local;
  
  resources.stack_storage.aligned_char._504_8_ = ep_args;
  SmallVector<Resource,_8UL>::SmallVector((SmallVector<Resource,_8UL> *)local_230);
  SmallVector<spirv_cross::SPIRVariable_*,_8UL>::clear(&this->entry_point_bindings);
  local_240.this = this;
  local_240.resources = (SmallVector<Resource,_8UL> *)local_230;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_240);
  pRVar3 = VectorView<Resource>::begin((VectorView<Resource> *)local_230);
  pRVar4 = VectorView<Resource>::end((VectorView<Resource> *)local_230);
  ::std::
  stable_sort<spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::Resource*,spirv_cross::CompilerMSL::entry_point_args_discrete_descriptors(std::__cxx11::string&)::__1>
            (pRVar3,pRVar4);
  __begin1 = (Resource *)local_230;
  __end1 = VectorView<Resource>::begin((VectorView<Resource> *)__begin1);
  r = VectorView<Resource>::end((VectorView<Resource> *)__begin1);
  do {
    if (__end1 == r) {
      SmallVector<Resource,_8UL>::~SmallVector((SmallVector<Resource,_8UL> *)local_230);
      return;
    }
    var = (SPIRVariable *)__end1;
    type = (SPIRType *)__end1->var;
    pSStack_280 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)type);
    m._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    switch((int)(var->dereference_chain).buffer_capacity) {
    case 0xf:
      primary_name.field_2._8_8_ =
           ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(pSStack_280->super_IVariant).self);
      sVar5 = VectorView<spirv_cross::Meta::Decoration>::size
                        (&(((mapped_type *)primary_name.field_2._8_8_)->members).
                          super_VectorView<spirv_cross::Meta::Decoration>);
      if (sVar5 != 0) {
        if (*(long *)&(var->super_IVariant).self == 0) {
          bVar1 = VectorView<unsigned_int>::empty
                            (&(pSStack_280->array).super_VectorView<unsigned_int>);
          if (bVar1) {
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_(&local_7a0,this,(SPIRVariable *)type);
            ::std::operator+(&local_780,&local_7a0," ");
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_780);
            ::std::__cxx11::string::~string((string *)&local_780);
            ::std::__cxx11::string::~string((string *)&local_7a0);
            local_7a4 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSStack_280->super_IVariant).self);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&this->recursive_inputs,&local_7a4);
            if (sVar10 == 0) {
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&local_8b0,this,pSStack_280,0);
              ::std::operator+(&local_890,&local_8b0,"& ");
              pcVar7 = to_restrict(this,m._4_4_,true);
              ::std::operator+(&local_870,&local_890,pcVar7);
              ::std::operator+(&local_850,&local_870,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &var->storage);
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_850
                        );
              ::std::__cxx11::string::~string((string *)&local_850);
              ::std::__cxx11::string::~string((string *)&local_870);
              ::std::__cxx11::string::~string((string *)&local_890);
              ::std::__cxx11::string::~string((string *)&local_8b0);
            }
            else {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_828,"void* ",&local_829);
              pcVar7 = to_restrict(this,m._4_4_,true);
              ::std::operator+(&local_808,&local_828,pcVar7);
              ::std::operator+(&local_7e8,&local_808,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &var->storage);
              ::std::operator+(&local_7c8,&local_7e8,"_vp");
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_7c8
                        );
              ::std::__cxx11::string::~string((string *)&local_7c8);
              ::std::__cxx11::string::~string((string *)&local_7e8);
              ::std::__cxx11::string::~string((string *)&local_808);
              ::std::__cxx11::string::~string((string *)&local_828);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
            }
            convert_to_string<unsigned_int,_0>
                      (&local_910,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+(&local_8f0," [[buffer(",&local_910);
            ::std::operator+(&local_8d0,&local_8f0,")");
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_8d0);
            ::std::__cxx11::string::~string((string *)&local_8d0);
            ::std::__cxx11::string::~string((string *)&local_8f0);
            ::std::__cxx11::string::~string((string *)&local_910);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
          }
          else {
            sVar5 = VectorView<unsigned_int>::size
                              (&(pSStack_280->array).super_VectorView<unsigned_int>);
            if (1 < sVar5) {
              pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar6,"Arrays of arrays of buffers are not supported.");
              __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            this->is_using_builtin_array = true;
            bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
            if (bVar1) {
              add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptorArray);
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,", ");
              }
              local_38c = (pSStack_280->super_IVariant).self.id;
              local_385 = Compiler::has_decoration((Compiler *)this,(ID)local_38c,BufferBlock);
              if (((type->basetype == Half) || ((bool)local_385)) &&
                 (((this->msl_options).runtime_array_rich_descriptor & 1U) != 0)) {
                add_spv_func_and_recompile(this,SPVFuncImplVariableSizedDescriptor);
                get_argument_address_space_abi_cxx11_(&local_430,this,(SPIRVariable *)type);
                ::std::operator+(&local_410,"const device spvBufferDescriptor<",&local_430);
                ::std::operator+(&local_3f0,&local_410," ");
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_450,this,pSStack_280,0);
                ::std::operator+(&local_3d0,&local_3f0,&local_450);
                ::std::operator+(&local_3b0,&local_3d0,"*>* ");
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)&local_3b0);
                ::std::__cxx11::string::~string((string *)&local_3b0);
                ::std::__cxx11::string::~string((string *)&local_3d0);
                ::std::__cxx11::string::~string((string *)&local_450);
                ::std::__cxx11::string::~string((string *)&local_3f0);
                ::std::__cxx11::string::~string((string *)&local_410);
                ::std::__cxx11::string::~string((string *)&local_430);
              }
              else {
                add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptor);
                get_argument_address_space_abi_cxx11_(&local_4f0,this,(SPIRVariable *)type);
                ::std::operator+(&local_4d0,"const device spvDescriptor<",&local_4f0);
                ::std::operator+(&local_4b0,&local_4d0," ");
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_510,this,pSStack_280,0);
                ::std::operator+(&local_490,&local_4b0,&local_510);
                ::std::operator+(&local_470,&local_490,"*>* ");
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)&local_470);
                ::std::__cxx11::string::~string((string *)&local_470);
                ::std::__cxx11::string::~string((string *)&local_490);
                ::std::__cxx11::string::~string((string *)&local_510);
                ::std::__cxx11::string::~string((string *)&local_4b0);
                ::std::__cxx11::string::~string((string *)&local_4d0);
                ::std::__cxx11::string::~string((string *)&local_4f0);
              }
              pcVar7 = to_restrict(this,m._4_4_,true);
              ::std::operator+(&local_550,pcVar7,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &var->storage);
              ::std::operator+(&local_530,&local_550,"_");
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_530
                        );
              ::std::__cxx11::string::~string((string *)&local_530);
              ::std::__cxx11::string::~string((string *)&local_550);
              convert_to_string<unsigned_int,_0>
                        ((string *)&i,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4))
              ;
              ::std::operator+(&local_590," [[buffer(",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &i);
              ::std::operator+(&local_570,&local_590,")");
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_570
                        );
              ::std::__cxx11::string::~string((string *)&local_570);
              ::std::__cxx11::string::~string((string *)&local_590);
              ::std::__cxx11::string::~string((string *)&i);
              sVar10 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                               (key_type *)((long)&m + 4));
              if (sVar10 != 0) {
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           ", raster_order_group(0)");
              }
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            }
            else {
              local_5b4 = get_resource_array_size(this,pSStack_280,m._4_4_);
              for (local_5b8 = 0; local_5b8 < local_5b4; local_5b8 = local_5b8 + 1) {
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)resources.stack_storage.aligned_char._504_8_,", ");
                }
                get_argument_address_space_abi_cxx11_(&local_6b8,this,(SPIRVariable *)type);
                ::std::operator+(&local_698,&local_6b8," ");
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                          (&local_6d8,this,pSStack_280,0);
                ::std::operator+(&local_678,&local_698,&local_6d8);
                ::std::operator+(&local_658,&local_678,"* ");
                pcVar7 = to_restrict(this,m._4_4_,true);
                ::std::operator+(&local_638,&local_658,pcVar7);
                ::std::operator+(&local_618,&local_638,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&var->storage);
                ::std::operator+(&local_5f8,&local_618,"_");
                convert_to_string<unsigned_int,_0>(&local_6f8,&local_5b8);
                ::std::operator+(&local_5d8,&local_5f8,&local_6f8);
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)&local_5d8);
                ::std::__cxx11::string::~string((string *)&local_5d8);
                ::std::__cxx11::string::~string((string *)&local_6f8);
                ::std::__cxx11::string::~string((string *)&local_5f8);
                ::std::__cxx11::string::~string((string *)&local_618);
                ::std::__cxx11::string::~string((string *)&local_638);
                ::std::__cxx11::string::~string((string *)&local_658);
                ::std::__cxx11::string::~string((string *)&local_678);
                ::std::__cxx11::string::~string((string *)&local_6d8);
                ::std::__cxx11::string::~string((string *)&local_698);
                ::std::__cxx11::string::~string((string *)&local_6b8);
                local_75c = *(int *)((long)&(var->dereference_chain).buffer_capacity + 4) +
                            local_5b8;
                convert_to_string<unsigned_int,_0>(&local_758,&local_75c);
                ::std::operator+(&local_738," [[buffer(",&local_758);
                ::std::operator+(&local_718,&local_738,")");
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,
                           (string *)&local_718);
                ::std::__cxx11::string::~string((string *)&local_718);
                ::std::__cxx11::string::~string((string *)&local_738);
                ::std::__cxx11::string::~string((string *)&local_758);
                sVar10 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                                 (key_type *)((long)&m + 4));
                if (sVar10 != 0) {
                  ::std::__cxx11::string::operator+=
                            ((string *)resources.stack_storage.aligned_char._504_8_,
                             ", raster_order_group(0)");
                }
                ::std::__cxx11::string::operator+=
                          ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
              }
            }
            this->is_using_builtin_array = false;
          }
        }
        else {
          if ((var->super_IVariant)._vptr_IVariant == *(_func_int ***)&(var->super_IVariant).self) {
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2b8,m._4_4_);
            local_2b4 = Compiler::get_decoration((Compiler *)this,local_2b8,DecorationDescriptorSet)
            ;
            TypedID<(spirv_cross::Types)0>::TypedID(&local_2c0,m._4_4_);
            local_2bc = Compiler::get_decoration((Compiler *)this,local_2c0,Binding);
            join<char_const(&)[18],unsigned_int,char_const(&)[8],unsigned_int>
                      ((string *)local_2b0,(spirv_cross *)"spvBufferAliasSet",
                       (char (*) [18])&local_2b4,(uint *)"Binding",(char (*) [8])&local_2bc,
                       (uint *)in_R9);
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,", ");
            }
            get_argument_address_space_abi_cxx11_(&local_320,this,(SPIRVariable *)type);
            ::std::operator+(&local_300,&local_320," void* ");
            ::std::operator+(&local_2e0,&local_300,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0);
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_2e0);
            ::std::__cxx11::string::~string((string *)&local_2e0);
            ::std::__cxx11::string::~string((string *)&local_300);
            ::std::__cxx11::string::~string((string *)&local_320);
            convert_to_string<unsigned_int,_0>
                      ((string *)local_380,
                       (uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
            ::std::operator+(&local_360," [[buffer(",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_380);
            ::std::operator+(&local_340,&local_360,")");
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_340);
            ::std::__cxx11::string::~string((string *)&local_340);
            ::std::__cxx11::string::~string((string *)&local_360);
            ::std::__cxx11::string::~string((string *)local_380);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                             (key_type *)((long)&m + 4));
            if (sVar10 != 0) {
              ::std::__cxx11::string::operator+=
                        ((string *)resources.stack_storage.aligned_char._504_8_,
                         ", raster_order_group(0)");
            }
            ::std::__cxx11::string::operator+=
                      ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
            ::std::__cxx11::string::~string((string *)local_2b0);
          }
          local_384 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)((var->super_IVariant)._vptr_IVariant + 1));
          SmallVector<unsigned_int,_8UL>::push_back(&this->buffer_aliases_discrete,&local_384);
        }
      }
      break;
    case 0x10:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
      local_a38 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      bVar1 = type_is_msl_framebuffer_fetch(this,local_a38);
      if (bVar1) {
        bVar1 = Options::is_macos(&this->msl_options);
        if ((bVar1) && (bVar1 = Options::supports_msl_version(&this->msl_options,2,3,0), !bVar1)) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar6,"Framebuffer fetch on Mac is not supported before MSL 2.3.");
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (&local_bd8,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(&local_bb8,&local_bd8," ");
        ::std::operator+(&local_b98,&local_bb8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_b98);
        ::std::__cxx11::string::~string((string *)&local_b98);
        ::std::__cxx11::string::~string((string *)&local_bb8);
        ::std::__cxx11::string::~string((string *)&local_bd8);
        convert_to_string<unsigned_int,_0>
                  (&local_c38,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+(&local_c18," [[color(",&local_c38);
        ::std::operator+(&local_bf8,&local_c18,")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_bf8);
        ::std::__cxx11::string::~string((string *)&local_bf8);
        ::std::__cxx11::string::~string((string *)&local_c18);
        ::std::__cxx11::string::~string((string *)&local_c38);
      }
      else {
        ts_1 = (uint *)(ulong)m._4_4_;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x17])
                  (&local_a98,this,pSStack_280);
        ::std::operator+(&local_a78,&local_a98," ");
        ::std::operator+(&local_a58,&local_a78,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_a58);
        ::std::__cxx11::string::~string((string *)&local_a58);
        ::std::__cxx11::string::~string((string *)&local_a78);
        ::std::__cxx11::string::~string((string *)&local_a98);
        if (*(int *)(var->dereference_chain).stack_storage.aligned_char != 0) {
          join<std::__cxx11::string&,unsigned_int&>
                    (&local_ab8,(spirv_cross *)&this->plane_name_suffix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(var->dereference_chain).stack_storage,ts_1);
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_ab8);
          ::std::__cxx11::string::~string((string *)&local_ab8);
        }
        bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
        if (bVar1) {
          convert_to_string<unsigned_int,_0>
                    (&local_b18,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
          ::std::operator+(&local_af8,"_ [[buffer(",&local_b18);
          ::std::operator+(&local_ad8,&local_af8,")");
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_ad8);
          ::std::__cxx11::string::~string((string *)&local_ad8);
          ::std::__cxx11::string::~string((string *)&local_af8);
          ::std::__cxx11::string::~string((string *)&local_b18);
        }
        else {
          convert_to_string<unsigned_int,_0>
                    (&local_b78,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
          ::std::operator+(&local_b58," [[texture(",&local_b78);
          ::std::operator+(&local_b38,&local_b58,")");
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_b38);
          ::std::__cxx11::string::~string((string *)&local_b38);
          ::std::__cxx11::string::~string((string *)&local_b58);
          ::std::__cxx11::string::~string((string *)&local_b78);
        }
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      flags._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->atomic_image_vars_emulated,(key_type *)((long)&flags + 4));
      if (sVar10 != 0) {
        cv_flags._4_4_ = (type->super_IVariant).self.id;
        local_c48 = ParsedIR::get_decoration_bitset
                              (&(this->super_CompilerGLSL).super_Compiler.ir,cv_flags._4_4_);
        bVar1 = decoration_flags_signal_volatile(local_c48);
        local_c58 = "";
        if (bVar1) {
          local_c58 = "volatile ";
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_a38->image);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_c98,this,pSVar9,0);
        join<char_const(&)[3],char_const*&,char_const(&)[15],std::__cxx11::string>
                  (&local_c78,(spirv_cross *)0x5a8753,(char (*) [3])&local_c58,
                   (char **)"device atomic_",(char (*) [15])local_c98,in_R9);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_c78);
        ::std::__cxx11::string::~string((string *)&local_c78);
        ::std::__cxx11::string::~string(local_c98);
        ::std::operator+(&local_cd8,"* ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::operator+(&local_cb8,&local_cd8,"_atomic");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_cb8);
        ::std::__cxx11::string::~string((string *)&local_cb8);
        ::std::__cxx11::string::~string((string *)&local_cd8);
        convert_to_string<unsigned_int,_0>
                  ((string *)&parent_type,
                   (uint *)((var->dereference_chain).stack_storage.aligned_char + 4));
        ::std::operator+(&local_d18," [[buffer(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parent_type);
        ::std::operator+(&local_cf8,&local_d18,")");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_cf8);
        ::std::__cxx11::string::~string((string *)&local_cf8);
        ::std::__cxx11::string::~string((string *)&local_d18);
        ::std::__cxx11::string::~string((string *)&parent_type);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                         (key_type *)((long)&m + 4));
        if (sVar10 != 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,
                     ", raster_order_group(0)");
        }
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      }
      break;
    default:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      if ((pSStack_280->pointer & 1U) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc)
        ;
        pSVar9 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        get_type_address_space_abi_cxx11_(&local_fc0,this,pSVar9,m._4_4_,false);
        ::std::operator+(&local_fa0,&local_fc0," ");
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_fe0,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(&local_f80,&local_fa0,&local_fe0);
        ::std::operator+(&local_f60,&local_f80,"& ");
        ::std::operator+(&local_f40,&local_f60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_f40);
        ::std::__cxx11::string::~string((string *)&local_f40);
        ::std::__cxx11::string::~string((string *)&local_f60);
        ::std::__cxx11::string::~string((string *)&local_f80);
        ::std::__cxx11::string::~string((string *)&local_fe0);
        ::std::__cxx11::string::~string((string *)&local_fa0);
        ::std::__cxx11::string::~string((string *)&local_fc0);
      }
      else {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_1040,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(&local_1020,&local_1040," ");
        ::std::operator+(&local_1000,&local_1020,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_1000);
        ::std::__cxx11::string::~string((string *)&local_1000);
        ::std::__cxx11::string::~string((string *)&local_1020);
        ::std::__cxx11::string::~string((string *)&local_1040);
      }
      convert_to_string<unsigned_int,_0>
                (&local_10a0,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
      ::std::operator+(&local_1080," [[buffer(",&local_10a0);
      ::std::operator+(&local_1060,&local_1080,")");
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_1060);
      ::std::__cxx11::string::~string((string *)&local_1060);
      ::std::__cxx11::string::~string((string *)&local_1080);
      ::std::__cxx11::string::~string((string *)&local_10a0);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,
                       (key_type *)((long)&m + 4));
      if (sVar10 != 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", raster_order_group(0)")
        ;
      }
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,"]]");
      break;
    case 0x12:
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,", ");
      }
      sampler_type_abi_cxx11_(&local_970,this,pSStack_280,m._4_4_,false);
      ::std::operator+(&local_950,&local_970," ");
      ::std::operator+(&local_930,&local_950,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &var->storage);
      ::std::__cxx11::string::operator+=
                ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_930);
      ::std::__cxx11::string::~string((string *)&local_930);
      ::std::__cxx11::string::~string((string *)&local_950);
      ::std::__cxx11::string::~string((string *)&local_970);
      bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
      if (bVar1) {
        convert_to_string<unsigned_int,_0>
                  (&local_9d0,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+(&local_9b0,"_ [[buffer(",&local_9d0);
        ::std::operator+(&local_990,&local_9b0,")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_990);
        ::std::__cxx11::string::~string((string *)&local_990);
        ::std::__cxx11::string::~string((string *)&local_9b0);
        ::std::__cxx11::string::~string((string *)&local_9d0);
      }
      else {
        convert_to_string<unsigned_int,_0>
                  ((string *)&basetype,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4)
                  );
        ::std::operator+(&local_a10," [[sampler(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &basetype);
        ::std::operator+(&local_9f0,&local_a10,")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_9f0);
        ::std::__cxx11::string::~string((string *)&local_9f0);
        ::std::__cxx11::string::~string((string *)&local_a10);
        ::std::__cxx11::string::~string((string *)&basetype);
      }
      break;
    case 0x13:
      bVar1 = is_var_runtime_size_array(this,(SPIRVariable *)type);
      if (bVar1) {
        add_spv_func_and_recompile(this,SPVFuncImplVariableDescriptor);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_280->parent_type);
        local_d40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,", ");
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_e00,this,local_d40,0);
        ::std::operator+(&local_de0,"const device spvDescriptor<",&local_e00);
        ::std::operator+(&local_dc0,&local_de0,">* ");
        pcVar7 = to_restrict(this,m._4_4_,true);
        ::std::operator+(&local_da0,&local_dc0,pcVar7);
        ::std::operator+(&local_d80,&local_da0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::operator+(&local_d60,&local_d80,"_");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_d60);
        ::std::__cxx11::string::~string((string *)&local_d60);
        ::std::__cxx11::string::~string((string *)&local_d80);
        ::std::__cxx11::string::~string((string *)&local_da0);
        ::std::__cxx11::string::~string((string *)&local_dc0);
        ::std::__cxx11::string::~string((string *)&local_de0);
        ::std::__cxx11::string::~string((string *)&local_e00);
        convert_to_string<unsigned_int,_0>
                  (&local_e60,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+(&local_e40," [[buffer(",&local_e60);
        ::std::operator+(&local_e20,&local_e40,")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_e20);
        ::std::__cxx11::string::~string((string *)&local_e20);
        ::std::__cxx11::string::~string((string *)&local_e40);
        ::std::__cxx11::string::~string((string *)&local_e60);
      }
      else {
        uVar8 = ::std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          ::std::__cxx11::string::operator+=
                    ((string *)resources.stack_storage.aligned_char._504_8_,", ");
        }
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_ec0,this,pSStack_280,(ulong)m._4_4_);
        ::std::operator+(&local_ea0,&local_ec0," ");
        ::std::operator+(&local_e80,&local_ea0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &var->storage);
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_e80);
        ::std::__cxx11::string::~string((string *)&local_e80);
        ::std::__cxx11::string::~string((string *)&local_ea0);
        ::std::__cxx11::string::~string((string *)&local_ec0);
        convert_to_string<unsigned_int,_0>
                  (&local_f20,(uint *)((long)&(var->dereference_chain).buffer_capacity + 4));
        ::std::operator+(&local_f00," [[buffer(",&local_f20);
        ::std::operator+(&local_ee0,&local_f00,")]]");
        ::std::__cxx11::string::operator+=
                  ((string *)resources.stack_storage.aligned_char._504_8_,(string *)&local_ee0);
        ::std::__cxx11::string::~string((string *)&local_ee0);
        ::std::__cxx11::string::~string((string *)&local_f00);
        ::std::__cxx11::string::~string((string *)&local_f20);
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::entry_point_args_discrete_descriptors(string &ep_args)
{
	// Output resources, sorted by resource index & type
	// We need to sort to work around a bug on macOS 10.13 with NVidia drivers where switching between shaders
	// with different order of buffers can result in issues with buffer assignments inside the driver.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *discrete_descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
		uint32_t secondary_index;
	};

	SmallVector<Resource> resources;

	entry_point_bindings.clear();
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			auto &type = get_variable_data_type(var);
			uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);

			if (is_supported_argument_buffer_type(type) && var.storage != StorageClassPushConstant)
			{
				if (descriptor_set_is_argument_buffer(desc_set))
				{
					if (is_var_runtime_size_array(var))
					{
						// Runtime arrays need to be wrapped in spvDescriptorArray from argument buffer payload.
						entry_point_bindings.push_back(&var);
						// We'll wrap this, so to_name() will always use non-qualified name.
						// We'll need the qualified name to create temporary variable instead.
						ir.meta[var_id].decoration.qualified_alias_explicit_override = true;
					}
					return;
				}
			}

			// Handle descriptor aliasing of simple discrete cases.
			// We can handle aliasing of buffers by casting pointers.
			// The amount of aliasing we can perform for discrete descriptors is very limited.
			// For fully mutable-style aliasing, we need argument buffers where we can exploit the fact
			// that descriptors are all 8 bytes.
			SPIRVariable *discrete_descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources)
				{
					if (get_decoration(resource.var->self, DecorationDescriptorSet) ==
					    get_decoration(var_id, DecorationDescriptorSet) &&
					    get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						discrete_descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.discrete_descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Emulate texture2D atomic operations
			uint32_t secondary_index = 0;
			if (atomic_image_vars_emulated.count(var.self))
			{
				secondary_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
			}

			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				entry_point_bindings.push_back(&var);
				for (uint32_t i = 0; i < plane_count; i++)
					resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), SPIRType::Image,
					                     get_metal_resource_index(var, SPIRType::Image, i), i, secondary_index });

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					resources.push_back({&var, discrete_descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler,
					                     get_metal_resource_index(var, SPIRType::Sampler), 0, 0 });
				}
			}
			else if (!constexpr_sampler)
			{
				// constexpr samplers are not declared as resources.
				add_resource_name(var_id);

				// Don't allocate resource indices for aliases.
				uint32_t resource_index = ~0u;
				if (!discrete_descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				entry_point_bindings.push_back(&var);
				resources.push_back({&var, discrete_descriptor_alias, to_name(var_id), type.basetype,
				                     resource_index, 0, secondary_index });
			}
		}
	});

	stable_sort(resources.begin(), resources.end(),
	            [](const Resource &lhs, const Resource &rhs)
	            { return tie(lhs.basetype, lhs.index) < tie(rhs.basetype, rhs.index); });

	for (auto &r : resources)
	{
		auto &var = *r.var;
		auto &type = get_variable_data_type(var);

		uint32_t var_id = var.self;

		switch (r.basetype)
		{
		case SPIRType::Struct:
		{
			auto &m = ir.meta[type.self];
			if (m.members.size() == 0)
				break;

			if (r.discrete_descriptor_alias)
			{
				if (r.var == r.discrete_descriptor_alias)
				{
					auto primary_name = join("spvBufferAliasSet",
					                         get_decoration(var_id, DecorationDescriptorSet),
					                         "Binding",
					                         get_decoration(var_id, DecorationBinding));

					// Declare the primary alias as void*
					if (!ep_args.empty())
						ep_args += ", ";
					ep_args += get_argument_address_space(var) + " void* " + primary_name;
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}

				buffer_aliases_discrete.push_back(r.var->self);
			}
			else if (!type.array.empty())
			{
				if (type.array.size() > 1)
					SPIRV_CROSS_THROW("Arrays of arrays of buffers are not supported.");

				is_using_builtin_array = true;
				if (is_var_runtime_size_array(var))
				{
					add_spv_func_and_recompile(SPVFuncImplVariableDescriptorArray);
					if (!ep_args.empty())
						ep_args += ", ";
					const bool ssbo = has_decoration(type.self, DecorationBufferBlock);
					if ((var.storage == spv::StorageClassStorageBuffer || ssbo) &&
					    msl_options.runtime_array_rich_descriptor)
					{
						add_spv_func_and_recompile(SPVFuncImplVariableSizedDescriptor);
						ep_args += "const device spvBufferDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					else
					{
						add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
						ep_args += "const device spvDescriptor<" + get_argument_address_space(var) + " " +
						           type_to_glsl(type) + "*>* ";
					}
					ep_args += to_restrict(var_id, true) + r.name + "_";
					ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
					if (interlocked_resources.count(var_id))
						ep_args += ", raster_order_group(0)";
					ep_args += "]]";
				}
				else
				{
					uint32_t array_size = get_resource_array_size(type, var_id);
					for (uint32_t i = 0; i < array_size; ++i)
					{
						if (!ep_args.empty())
							ep_args += ", ";
						ep_args += get_argument_address_space(var) + " " + type_to_glsl(type) + "* " +
						           to_restrict(var_id, true) + r.name + "_" + convert_to_string(i);
						ep_args += " [[buffer(" + convert_to_string(r.index + i) + ")";
						if (interlocked_resources.count(var_id))
							ep_args += ", raster_order_group(0)";
						ep_args += "]]";
					}
				}
				is_using_builtin_array = false;
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += get_argument_address_space(var) + " ";

				if (recursive_inputs.count(type.self))
					ep_args += string("void* ") + to_restrict(var_id, true) + r.name + "_vp";
				else
					ep_args += type_to_glsl(type) + "& " + to_restrict(var_id, true) + r.name;

				ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::Sampler:
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += sampler_type(type, var_id, false) + " " + r.name;
			if (is_var_runtime_size_array(var))
				ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")]]";
			else
				ep_args += " [[sampler(" + convert_to_string(r.index) + ")]]";
			break;
		case SPIRType::Image:
		{
			if (!ep_args.empty())
				ep_args += ", ";

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			const auto &basetype = get<SPIRType>(var.basetype);
			if (!type_is_msl_framebuffer_fetch(basetype))
			{
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				if (r.plane > 0)
					ep_args += join(plane_name_suffix, r.plane);

				if (is_var_runtime_size_array(var))
					ep_args += "_ [[buffer(" + convert_to_string(r.index) + ")";
				else
					ep_args += " [[texture(" + convert_to_string(r.index) + ")";

				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			else
			{
				if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("Framebuffer fetch on Mac is not supported before MSL 2.3.");
				ep_args += image_type_glsl(type, var_id, false) + " " + r.name;
				ep_args += " [[color(" + convert_to_string(r.index) + ")]]";
			}

			// Emulate texture2D atomic operations
			if (atomic_image_vars_emulated.count(var.self))
			{
				auto &flags = ir.get_decoration_bitset(var.self);
				const char *cv_flags = decoration_flags_signal_volatile(flags) ? "volatile " : "";
				ep_args += join(", ", cv_flags, "device atomic_", type_to_glsl(get<SPIRType>(basetype.image.type), 0));
				ep_args += "* " + r.name + "_atomic";
				ep_args += " [[buffer(" + convert_to_string(r.secondary_index) + ")";
				if (interlocked_resources.count(var_id))
					ep_args += ", raster_order_group(0)";
				ep_args += "]]";
			}
			break;
		}
		case SPIRType::AccelerationStructure:
		{
			if (is_var_runtime_size_array(var))
			{
				add_spv_func_and_recompile(SPVFuncImplVariableDescriptor);
				const auto &parent_type = get<SPIRType>(type.parent_type);
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += "const device spvDescriptor<" + type_to_glsl(parent_type) + ">* " +
				           to_restrict(var_id, true) + r.name + "_";
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			else
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
				ep_args += " [[buffer(" + convert_to_string(r.index) + ")]]";
			}
			break;
		}
		default:
			if (!ep_args.empty())
				ep_args += ", ";
			if (!type.pointer)
				ep_args += get_type_address_space(get<SPIRType>(var.basetype), var_id) + " " +
				           type_to_glsl(type, var_id) + "& " + r.name;
			else
				ep_args += type_to_glsl(type, var_id) + " " + r.name;
			ep_args += " [[buffer(" + convert_to_string(r.index) + ")";
			if (interlocked_resources.count(var_id))
				ep_args += ", raster_order_group(0)";
			ep_args += "]]";
			break;
		}
	}
}